

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O1

void EPD_Text(uint16_t Xpos,uint16_t Ypos,uint8_t *str,uint8_t Color,uint8_t bkColor)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  
  puVar2 = str + 1;
  do {
    EPD_PutChar(Xpos,Ypos,puVar2[-1],Color,bkColor);
    if ((int)(uint)Xpos < (int)(gstI80DevInfo.usPanelW - 8)) {
      Xpos = Xpos + 8;
    }
    else {
      Xpos = 0;
      if ((int)(uint)Ypos < (int)(gstI80DevInfo.usPanelH - 0x10)) {
        Ypos = Ypos + 0x10;
      }
      else {
        Ypos = 0;
      }
    }
    uVar1 = *puVar2;
    puVar2 = puVar2 + 1;
  } while (uVar1 != '\0');
  return;
}

Assistant:

void EPD_Text(uint16_t Xpos,uint16_t Ypos,uint8_t *str,uint8_t Color,uint8_t bkColor)
{
	uint8_t TempChar;
	do
	{
		TempChar = *str++;  
		EPD_PutChar(Xpos, Ypos, TempChar, Color, bkColor);    
		if(Xpos < gstI80DevInfo.usPanelW - 8)
		{
			Xpos += 8;
		} 
		else if (Ypos < gstI80DevInfo.usPanelH - 16)
		{
			Xpos = 0;
			Ypos += 16;
		}   
	else
	{
		Xpos = 0;
		Ypos = 0;
	}    
    }
    while (*str != 0);
}